

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

void __thiscall
deqp::gls::BuiltinPrecisionTests::PrecisionCase::
testStatement<deqp::gls::BuiltinPrecisionTests::InTypes<float,float,float,deqp::gls::BuiltinPrecisionTests::Void>,deqp::gls::BuiltinPrecisionTests::OutTypes<float,deqp::gls::BuiltinPrecisionTests::Void>>
          (PrecisionCase *this,
          Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *variables,
          Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
          *inputs,Statement *stmt)

{
  FloatFormat *this_00;
  float fVar1;
  pointer pfVar2;
  pointer pfVar3;
  Variable<float> *pVVar4;
  pointer pcVar5;
  ostringstream oVar6;
  PrecisionCase *pPVar7;
  PrecisionCase *pPVar8;
  bool bVar9;
  ContextType type;
  int iVar10;
  uint uVar11;
  undefined8 uVar12;
  char *__s;
  size_t sVar13;
  long *plVar14;
  ShaderExecutor *pSVar15;
  IVal *pIVar16;
  TestError *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar17;
  size_t sVar18;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pIVar19;
  IVal IVar20;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *pVVar21;
  ulong uVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  FuncSet funcs;
  IVal reference1;
  IVal in3;
  ostringstream os;
  Environment env;
  FloatFormat highpFmt;
  ostringstream oss;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  outputs;
  ShaderSpec spec;
  undefined1 auStack_4f8 [8];
  PrecisionCase *local_4f0;
  Variables<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4e8;
  undefined1 local_4e0 [8];
  undefined8 local_4d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4d0;
  _Rb_tree_node_base *local_4c0;
  size_t local_4b8;
  IVal local_4a9;
  Inputs<deqp::gls::BuiltinPrecisionTests::InTypes<float,_float,_float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  *local_4a8;
  Statement *local_4a0;
  string local_498;
  size_t local_478;
  ulong local_470;
  IVal local_468;
  undefined1 local_448 [8];
  double dStack_440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_438;
  double local_428;
  Data local_420;
  undefined4 local_410;
  ios_base local_3d8 [8];
  ios_base local_3d0 [264];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  local_2c8;
  ulong local_298;
  ResultCollector *local_290;
  FloatFormat local_288;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [3];
  ios_base local_1e8 [272];
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  local_d8;
  undefined1 local_a8 [56];
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  pfVar2 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  pfVar3 = (inputs->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_finish;
  sVar18 = (long)pfVar3 - (long)pfVar2 >> 2;
  local_4a8 = inputs;
  local_4a0 = stmt;
  Outputs<deqp::gls::BuiltinPrecisionTests::OutTypes<float,_deqp::gls::BuiltinPrecisionTests::Void>_>
  ::Outputs(&local_d8,sVar18);
  local_70._M_p = (pointer)&local_60;
  local_a8._0_4_ = GLSL_VERSION_300_ES;
  local_a8._8_8_ = (pointer)0x0;
  local_a8._16_8_ = (pointer)0x0;
  local_a8._24_8_ = (pointer)0x0;
  local_a8._32_8_ = (pointer)0x0;
  local_a8._40_8_ = (pointer)0x0;
  local_a8._48_8_ = (pointer)0x0;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_50._M_p = (pointer)&local_40;
  local_48 = 0;
  local_40._M_local_buf[0] = '\0';
  local_288.m_maxValue = (this->m_ctx).highpFormat.m_maxValue;
  local_288.m_minExp = (this->m_ctx).highpFormat.m_minExp;
  local_288.m_maxExp = (this->m_ctx).highpFormat.m_maxExp;
  local_288.m_fractionBits = (this->m_ctx).highpFormat.m_fractionBits;
  local_288.m_hasSubnormal = (this->m_ctx).highpFormat.m_hasSubnormal;
  local_288.m_hasInf = (this->m_ctx).highpFormat.m_hasInf;
  local_288.m_hasNaN = (this->m_ctx).highpFormat.m_hasNaN;
  local_288.m_exactPrecision = (this->m_ctx).highpFormat.m_exactPrecision;
  local_288._25_7_ = *(undefined7 *)&(this->m_ctx).highpFormat.field_0x19;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_2c8._M_impl.super__Rb_tree_header._M_header;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2c8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_448 = (undefined1  [8])((this->super_TestCase).super_TestNode.m_testCtx)->m_log;
  local_4f0 = this;
  local_2c8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_2c8._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_440);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"Statement: ",0xb);
  (*local_4a0->_vptr_Statement[2])(local_4a0,(ostringstream *)&dStack_440);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  local_4e8 = variables;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_440);
  std::ios_base::~ios_base(local_3d0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_258);
  local_4d8 = (double)((ulong)local_4d8._4_4_ << 0x20);
  aStack_4d0._M_allocated_capacity = 0;
  local_4b8 = 0;
  aStack_4d0._8_8_ = (_Rb_tree_node_base *)&local_4d8;
  local_4c0 = (_Rb_tree_node_base *)&local_4d8;
  local_478 = sVar18;
  (*local_4a0->_vptr_Statement[4])(local_4a0,local_4e0);
  if ((_Rb_tree_node_base *)aStack_4d0._8_8_ != (_Rb_tree_node_base *)&local_4d8) {
    uVar12 = aStack_4d0._8_8_;
    do {
      (**(code **)(**(long **)(uVar12 + 0x20) + 0x30))(*(long **)(uVar12 + 0x20),local_258);
      uVar12 = std::_Rb_tree_increment((_Rb_tree_node_base *)uVar12);
    } while ((_Rb_tree_node_base *)uVar12 != (_Rb_tree_node_base *)&local_4d8);
  }
  pVVar21 = local_4e8;
  if (local_4b8 != 0) {
    local_448 = (undefined1  [8])((local_4f0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_440);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_440,"Reference definitions:\n",0x17);
    std::__cxx11::stringbuf::str();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&dStack_440,
               (char *)CONCAT71(local_498._M_dataplus._M_p._1_7_,local_498._M_dataplus._M_p._0_1_),
               local_498._M_string_length);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_498._M_dataplus._M_p._1_7_,local_498._M_dataplus._M_p._0_1_) !=
        &local_498.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_498._M_dataplus._M_p._1_7_,local_498._M_dataplus._M_p._0_1_),
                      local_498.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_440);
    std::ios_base::~ios_base(local_3d0);
  }
  std::
  _Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
  ::~_Rb_tree((_Rb_tree<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_const_deqp::gls::BuiltinPrecisionTests::FuncBase_*,_std::_Identity<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::less<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>,_std::allocator<const_deqp::gls::BuiltinPrecisionTests::FuncBase_*>_>
               *)local_4e0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_258);
  std::ios_base::~ios_base(local_1e8);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,"precision ",10);
  __s = glu::getPrecisionName((local_4f0->m_ctx).precision);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(auStack_4f8 + *(long *)((long)local_448 + -0x18)) + 0xb0);
  }
  else {
    sVar13 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448,__s,sVar13);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_448," float;\n",8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_70,(string *)local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258[0]._M_dataplus._M_p != &local_258[0].field_2) {
    operator_delete(local_258[0]._M_dataplus._M_p,local_258[0].field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  type.super_ApiType.m_bits =
       (ApiType)(*((local_4f0->m_ctx).renderContext)->_vptr_RenderContext[2])();
  local_a8._0_4_ = glu::getContextTypeGLSLVersion(type);
  if ((local_4f0->m_extension)._M_string_length != 0) {
    std::operator+(local_258,"#extension ",&local_4f0->m_extension);
    plVar14 = (long *)std::__cxx11::string::append((char *)local_258);
    paVar17 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar14 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar14 == paVar17) {
      aStack_438._M_allocated_capacity = paVar17->_M_allocated_capacity;
      aStack_438._8_8_ = plVar14[3];
      local_448 = (undefined1  [8])&aStack_438;
    }
    else {
      aStack_438._M_allocated_capacity = paVar17->_M_allocated_capacity;
      local_448 = (undefined1  [8])*plVar14;
    }
    dStack_440 = (double)plVar14[1];
    *plVar14 = (long)paVar17;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_70,(string *)local_448);
    if (local_448 != (undefined1  [8])&aStack_438) {
      operator_delete((void *)local_448,aStack_438._M_allocated_capacity + 1);
    }
    pVVar21 = local_4e8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_258[0]._M_dataplus._M_p != &local_258[0].field_2) {
      operator_delete(local_258[0]._M_dataplus._M_p,local_258[0].field_2._M_allocated_capacity + 1);
    }
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 8),3);
  makeSymbol<float>((Symbol *)local_448,local_4f0,
                    (pVVar21->in2).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_a8._8_8_;
  std::__cxx11::string::operator=((string *)(local_a8._8_8_ + 0x70),(string *)local_448);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x70))->varType,(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if (local_448 != (undefined1  [8])&aStack_438) {
    operator_delete((void *)local_448,aStack_438._M_allocated_capacity + 1);
  }
  makeSymbol<float>((Symbol *)local_448,local_4f0,
                    (pVVar21->in1).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_a8._8_8_;
  std::__cxx11::string::operator=((string *)(local_a8._8_8_ + 0x38),(string *)local_448);
  glu::VarType::operator=(&((pointer)(uVar12 + 0x38))->varType,(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if (local_448 != (undefined1  [8])&aStack_438) {
    operator_delete((void *)local_448,aStack_438._M_allocated_capacity + 1);
  }
  makeSymbol<float>((Symbol *)local_448,local_4f0,
                    (pVVar21->in0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_a8._8_8_;
  std::__cxx11::string::operator=((string *)local_a8._8_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if (local_448 != (undefined1  [8])&aStack_438) {
    operator_delete((void *)local_448,aStack_438._M_allocated_capacity + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::resize((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
            *)(local_a8 + 0x20),1);
  makeSymbol<float>((Symbol *)local_448,local_4f0,
                    (pVVar21->out0).
                    super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr)
  ;
  uVar12 = local_a8._32_8_;
  std::__cxx11::string::operator=((string *)local_a8._32_8_,(string *)local_448);
  glu::VarType::operator=((VarType *)(uVar12 + 0x20),(VarType *)&local_428);
  glu::VarType::~VarType((VarType *)&local_428);
  if (local_448 != (undefined1  [8])&aStack_438) {
    operator_delete((void *)local_448,aStack_438._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_448);
  (*local_4a0->_vptr_Statement[2])(local_4a0,local_448);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_448);
  std::ios_base::~ios_base(local_3d8);
  std::__cxx11::string::operator=((string *)&local_50,(string *)local_258);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258[0]._M_dataplus._M_p != &local_258[0].field_2) {
    operator_delete(local_258[0]._M_dataplus._M_p,local_258[0].field_2._M_allocated_capacity + 1);
  }
  pPVar7 = local_4f0;
  pSVar15 = ShaderExecUtil::createExecutor
                      ((local_4f0->m_ctx).renderContext,(local_4f0->m_ctx).shaderType,
                       (ShaderSpec *)local_a8);
  sVar18 = local_478;
  local_448 = (undefined1  [8])
              (local_4a8->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start;
  dStack_440 = (double)(local_4a8->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start;
  aStack_438._M_allocated_capacity =
       (size_type)
       (local_4a8->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
       super__Vector_impl_data._M_start;
  aStack_438._8_8_ =
       (local_4a8->in3).
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_258[0]._M_dataplus._M_p =
       (pointer)local_d8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_258[0]._M_string_length =
       (size_type)
       local_d8.out1.
       super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (*pSVar15->_vptr_ShaderExecutor[3])
            (pSVar15,((pPVar7->super_TestCase).super_TestNode.m_testCtx)->m_log);
  iVar10 = (*pSVar15->_vptr_ShaderExecutor[2])(pSVar15);
  if ((char)iVar10 == '\0') {
    this_01 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_01,"Shader compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsBuiltinPrecisionTests.cpp"
               ,0x11d4);
    __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*pSVar15->_vptr_ShaderExecutor[5])(pSVar15);
  (*pSVar15->_vptr_ShaderExecutor[6])(pSVar15,sVar18 & 0xffffffff,local_448);
  (*pSVar15->_vptr_ShaderExecutor[1])(pSVar15);
  local_448 = (undefined1  [8])((ulong)local_448 & 0xffffffffffffff00);
  dStack_440 = INFINITY;
  aStack_438._M_allocated_capacity = 0xfff0000000000000;
  local_258[0]._M_dataplus._M_p = local_258[0]._M_dataplus._M_p & 0xffffffffffffff00;
  local_258[0]._M_string_length = 0x7ff0000000000000;
  local_258[0].field_2._M_allocated_capacity = -INFINITY;
  local_4e0[0] = false;
  local_4d8 = INFINITY;
  aStack_4d0._M_allocated_capacity = 0xfff0000000000000;
  local_498._M_dataplus._M_p._0_1_ = 0;
  local_498._M_string_length = 0x7ff0000000000000;
  local_498.field_2._M_allocated_capacity = 0xfff0000000000000;
  Environment::bind<float>
            ((Environment *)&local_2c8,
             (pVVar21->in0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_448);
  Environment::bind<float>
            ((Environment *)&local_2c8,
             (pVVar21->in1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_258);
  Environment::bind<float>
            ((Environment *)&local_2c8,
             (pVVar21->in2).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)local_4e0);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c8,
             (pVVar21->in3).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,(IVal *)&local_468);
  Environment::bind<float>
            ((Environment *)&local_2c8,
             (pVVar21->out0).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr,
             (IVal *)&local_498);
  Environment::bind<deqp::gls::BuiltinPrecisionTests::Void>
            ((Environment *)&local_2c8,
             (pVVar21->out1).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
             .m_ptr,&local_4a9);
  pPVar7 = local_4f0;
  if (pfVar3 == pfVar2) {
LAB_006c45d3:
    local_448 = (undefined1  [8])((local_4f0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"All ",4);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440," inputs passed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  else {
    this_00 = &(local_4f0->m_ctx).floatFormat;
    local_290 = &local_4f0->m_status;
    local_298 = sVar18 + (sVar18 == 0);
    lVar23 = 0;
    uVar22 = 0;
    local_470 = 0;
    pIVar19 = local_4a8;
    do {
      local_468._0_8_ = local_468._0_8_ & 0xffffffffffffff00;
      local_468.m_lo = INFINITY;
      local_468.m_hi = -INFINITY;
      if ((uVar22 & 0xfff) == 0) {
        tcu::TestContext::touchWatchdog((local_4f0->super_TestCase).super_TestNode.m_testCtx);
      }
      fVar1 = (pIVar19->in0).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22];
      dVar25 = (double)fVar1;
      oVar6 = (ostringstream)NAN(fVar1);
      dStack_440 = INFINITY;
      if (!(bool)oVar6) {
        dStack_440 = dVar25;
      }
      aStack_438._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)oVar6) {
        aStack_438._M_allocated_capacity = (size_type)dVar25;
      }
      local_448[0] = oVar6;
      tcu::FloatFormat::roundOut((Interval *)local_4e0,this_00,(Interval *)local_448,false);
      tcu::FloatFormat::convert((Interval *)local_258,this_00,(Interval *)local_4e0);
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2c8,
                           (local_4e8->in0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar16->m_hi = (double)local_258[0].field_2._0_8_;
      *(pointer *)pIVar16 = local_258[0]._M_dataplus._M_p;
      pIVar16->m_lo = (double)local_258[0]._M_string_length;
      fVar1 = (pIVar19->in1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22];
      dVar25 = (double)fVar1;
      local_448[0] = (ostringstream)NAN(fVar1);
      dStack_440 = INFINITY;
      if (!(bool)local_448[0]) {
        dStack_440 = dVar25;
      }
      aStack_438._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)local_448[0]) {
        aStack_438._M_allocated_capacity = (size_type)dVar25;
      }
      tcu::FloatFormat::roundOut((Interval *)local_4e0,this_00,(Interval *)local_448,false);
      tcu::FloatFormat::convert((Interval *)local_258,this_00,(Interval *)local_4e0);
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2c8,
                           (local_4e8->in1).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pPVar8 = local_4f0;
      pIVar16->m_hi = (double)local_258[0].field_2._0_8_;
      *(pointer *)pIVar16 = local_258[0]._M_dataplus._M_p;
      pIVar16->m_lo = (double)local_258[0]._M_string_length;
      fVar1 = (pIVar19->in2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22];
      dVar25 = (double)fVar1;
      local_448[0] = (ostringstream)NAN(fVar1);
      dStack_440 = INFINITY;
      if (!(bool)local_448[0]) {
        dStack_440 = dVar25;
      }
      aStack_438._M_allocated_capacity = (size_type)-INFINITY;
      if (!(bool)local_448[0]) {
        aStack_438._M_allocated_capacity = (size_type)dVar25;
      }
      tcu::FloatFormat::roundOut((Interval *)local_4e0,this_00,(Interval *)local_448,false);
      tcu::FloatFormat::convert((Interval *)local_258,this_00,(Interval *)local_4e0);
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2c8,
                           (local_4e8->in2).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      pIVar16->m_hi = (double)local_258[0].field_2._0_8_;
      *(pointer *)pIVar16 = local_258[0]._M_dataplus._M_p;
      pIVar16->m_lo = (double)local_258[0]._M_string_length;
      Environment::lookup<deqp::gls::BuiltinPrecisionTests::Void>
                ((Environment *)&local_2c8,
                 (local_4e8->in3).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<deqp::gls::BuiltinPrecisionTests::Void>_>
                 .m_ptr);
      local_420.basic.type = (pPVar8->m_ctx).precision;
      local_428 = (pPVar7->m_ctx).floatFormat.m_maxValue;
      local_448 = *(undefined1 (*) [8])this_00;
      dStack_440 = *(double *)&(pPVar7->m_ctx).floatFormat.m_fractionBits;
      aStack_438._M_allocated_capacity = *(undefined8 *)&(pPVar7->m_ctx).floatFormat.m_hasInf;
      aStack_438._8_8_ = *(undefined8 *)&(pPVar7->m_ctx).floatFormat.m_exactPrecision;
      local_410 = 0;
      local_420._8_8_ = &local_2c8;
      (*local_4a0->_vptr_Statement[3])(local_4a0,(MessageBuilder *)local_448);
      pIVar16 = Environment::lookup<float>
                          ((Environment *)&local_2c8,
                           (local_4e8->out0).
                           super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>
                           .m_ptr);
      tcu::FloatFormat::convert((Interval *)local_448,&local_288,pIVar16);
      local_468.m_hi = (double)aStack_438._M_allocated_capacity;
      local_468._0_8_ = local_448;
      uVar12 = local_468._0_8_;
      local_468.m_lo = dStack_440;
      fVar1 = local_d8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start[uVar22];
      dVar24 = (double)fVar1;
      dVar25 = dVar24;
      if (NAN(fVar1)) {
        dVar25 = INFINITY;
        dVar24 = -INFINITY;
      }
      IVar20 = (IVal)(dVar24 <= (double)aStack_438._M_allocated_capacity && dStack_440 <= dVar25);
      if ((NAN(fVar1)) &&
         (dVar24 <= (double)aStack_438._M_allocated_capacity && dStack_440 <= dVar25)) {
        local_468.m_hasNaN = local_448[0];
        IVar20 = (IVal)local_468.m_hasNaN;
      }
      local_448 = (undefined1  [8])&aStack_438;
      local_468._0_8_ = uVar12;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_448,"Shader output 0 is outside acceptable range","");
      bVar9 = tcu::ResultCollector::check(local_290,(bool)((byte)IVar20 & 1),(string *)local_448);
      if (local_448 != (undefined1  [8])&aStack_438) {
        operator_delete((void *)local_448,aStack_438._M_allocated_capacity + 1);
      }
      pIVar19 = local_4a8;
      if ((!bVar9) && (uVar11 = (int)local_470 + 1, local_470 = (ulong)uVar11, (int)uVar11 < 0x65))
      {
        local_448 = (undefined1  [8])((pPVar8->super_TestCase).super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_440);
        pIVar19 = local_4a8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"Failed",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440," sample:\n",9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"\t",1);
        pVVar4 = (local_4e8->in0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_258[0]._M_dataplus._M_p = (pointer)&local_258[0].field_2;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,local_258[0]._M_dataplus._M_p,
                   local_258[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440," = ",3);
        valueToString<float>
                  ((string *)local_4e0,&local_288,
                   (float *)((long)(pIVar19->in0).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar23));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,(char *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                   (long)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4e0._1_7_,local_4e0[0]) != &aStack_4d0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                          (ulong)(aStack_4d0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258[0]._M_dataplus._M_p != &local_258[0].field_2) {
          operator_delete(local_258[0]._M_dataplus._M_p,
                          local_258[0].field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"\t",1);
        pVVar4 = (local_4e8->in1).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_258[0]._M_dataplus._M_p = (pointer)&local_258[0].field_2;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,local_258[0]._M_dataplus._M_p,
                   local_258[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440," = ",3);
        valueToString<float>
                  ((string *)local_4e0,&local_288,
                   (float *)((long)(pIVar19->in1).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar23));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,(char *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                   (long)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4e0._1_7_,local_4e0[0]) != &aStack_4d0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                          (ulong)(aStack_4d0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258[0]._M_dataplus._M_p != &local_258[0].field_2) {
          operator_delete(local_258[0]._M_dataplus._M_p,
                          local_258[0].field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"\t",1);
        pVVar4 = (local_4e8->in2).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_258[0]._M_dataplus._M_p = (pointer)&local_258[0].field_2;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,local_258[0]._M_dataplus._M_p,
                   local_258[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440," = ",3);
        valueToString<float>
                  ((string *)local_4e0,&local_288,
                   (float *)((long)(pIVar19->in2).super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar23));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,(char *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                   (long)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4e0._1_7_,local_4e0[0]) != &aStack_4d0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                          (ulong)(aStack_4d0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258[0]._M_dataplus._M_p != &local_258[0].field_2) {
          operator_delete(local_258[0]._M_dataplus._M_p,
                          local_258[0].field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"\t",1);
        pVVar4 = (local_4e8->out0).
                 super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<float>_>.m_ptr;
        local_258[0]._M_dataplus._M_p = (pointer)&local_258[0].field_2;
        pcVar5 = (pVVar4->m_name)._M_dataplus._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_258,pcVar5,pcVar5 + (pVVar4->m_name)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,local_258[0]._M_dataplus._M_p,
                   local_258[0]._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440," = ",3);
        valueToString<float>
                  ((string *)local_4e0,&local_288,
                   (float *)((long)local_d8.out0.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_start + lVar23));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,(char *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                   (long)local_4d8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,"\tExpected range: ",0x11);
        intervalToString<float>(&local_498,&local_288,&local_468);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&dStack_440,
                   (char *)CONCAT71(local_498._M_dataplus._M_p._1_7_,
                                    local_498._M_dataplus._M_p._0_1_),local_498._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_498._M_dataplus._M_p._1_7_,local_498._M_dataplus._M_p._0_1_) !=
            &local_498.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_498._M_dataplus._M_p._1_7_,local_498._M_dataplus._M_p._0_1_
                                  ),local_498.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_4e0._1_7_,local_4e0[0]) != &aStack_4d0) {
          operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)CONCAT71(local_4e0._1_7_,local_4e0[0]),
                          (ulong)(aStack_4d0._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258[0]._M_dataplus._M_p != &local_258[0].field_2) {
          operator_delete(local_258[0]._M_dataplus._M_p,
                          local_258[0].field_2._M_allocated_capacity + 1);
        }
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_440);
        std::ios_base::~ios_base(local_3d0);
      }
      uVar22 = uVar22 + 1;
      lVar23 = lVar23 + 4;
    } while (local_298 != uVar22);
    iVar10 = (int)local_470;
    if (iVar10 < 0x65) {
      if (iVar10 == 0) goto LAB_006c45d3;
    }
    else {
      local_448 = (undefined1  [8])((local_4f0->super_TestCase).super_TestNode.m_testCtx)->m_log;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_440);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"(Skipped ",9);
      std::ostream::operator<<((ostringstream *)&dStack_440,iVar10 + -100);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440," messages.)",0xb);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_440);
      std::ios_base::~ios_base(local_3d0);
    }
    local_448 = (undefined1  [8])((local_4f0->super_TestCase).super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&dStack_440);
    std::ostream::operator<<((ostringstream *)&dStack_440,iVar10);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440,"/",1);
    std::ostream::_M_insert<unsigned_long>((ulong)&dStack_440);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&dStack_440," inputs failed.",0xf)
    ;
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_448,(EndMessageToken *)&tcu::TestLog::EndMessage);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&dStack_440);
  std::ios_base::~ios_base(local_3d0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree(&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_p != &local_40) {
    operator_delete(local_50._M_p,
                    CONCAT71(local_40._M_allocated_capacity._1_7_,local_40._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_p != &local_60) {
    operator_delete(local_70._M_p,
                    CONCAT71(local_60._M_allocated_capacity._1_7_,local_60._M_local_buf[0]) + 1);
  }
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 0x20));
  std::vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  ::~vector((vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
             *)(local_a8 + 8));
  if (local_d8.out1.
      super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.out1.
                    super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.out1.
                          super__Vector_base<deqp::gls::BuiltinPrecisionTests::Void,_std::allocator<deqp::gls::BuiltinPrecisionTests::Void>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_d8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_d8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.out0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void PrecisionCase::testStatement (const Variables<In, Out>&	variables,
								   const Inputs<In>&			inputs,
								   const Statement&				stmt)
{
	using namespace ShaderExecUtil;

	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	const FloatFormat&	fmt			= getFormat();
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	ShaderSpec			spec;
	const FloatFormat	highpFmt	= m_ctx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	// Print out the statement and its definitions
	log() << TestLog::Message << "Statement: " << stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		stmt.getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			log() << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	// Initialize ShaderSpec from precision, variables and statement.
	{
		ostringstream os;
		os << "precision " << glu::getPrecisionName(m_ctx.precision) << " float;\n";
		spec.globalDeclarations = os.str();
	}

	spec.version = getContextTypeGLSLVersion(getRenderContext().getType());

	if (!m_extension.empty())
		spec.globalDeclarations = "#extension " + m_extension + " : require\n";

	spec.inputs.resize(inCount);

	switch (inCount)
	{
		case 4: spec.inputs[3] = makeSymbol(*variables.in3);
		case 3:	spec.inputs[2] = makeSymbol(*variables.in2);
		case 2:	spec.inputs[1] = makeSymbol(*variables.in1);
		case 1:	spec.inputs[0] = makeSymbol(*variables.in0);
		default: break;
	}

	spec.outputs.resize(outCount);

	switch (outCount)
	{
		case 2:	spec.outputs[1] = makeSymbol(*variables.out1);
		case 1:	spec.outputs[0] = makeSymbol(*variables.out0);
		default: break;
	}

	spec.source = de::toString(stmt);

	// Run the shader with inputs.
	{
		UniquePtr<ShaderExecutor>	executor		(createExecutor(getRenderContext(),
																	m_ctx.shaderType,
																	spec));
		const void*					inputArr[]		=
		{
			&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
		};
		void*						outputArr[]		=
		{
			&outputs.out0.front(), &outputs.out1.front(),
		};

		executor->log(log());
		if (!executor->isOk())
			TCU_FAIL("Shader compilation failed");

		executor->useProgram();
		executor->execute(int(numValues), inputArr, outputArr);
	}

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*variables.in0, in0);
		env.bind(*variables.in1, in1);
		env.bind(*variables.in2, in2);
		env.bind(*variables.in3, in3);
		env.bind(*variables.out0, reference0);
		env.bind(*variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		if (valueNdx % (size_t)TOUCH_WATCHDOG_VALUE_FREQUENCY == 0)
			m_testCtx.touchWatchdog();

		env.lookup(*variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_ctx.precision, env);
			stmt.execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*variables.out1));
				if (!m_status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*variables.out0));
				if (!m_status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= log().message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		log() << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		log() << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		log() << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}
}